

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int count_cols(MATRIX *matrix,int n,int j)

{
  size_type sVar1;
  reference this;
  reference pvVar2;
  undefined4 local_20;
  undefined4 local_1c;
  int i;
  int n_columns;
  int j_local;
  int n_local;
  MATRIX *matrix_local;
  
  local_1c = 0;
  local_20 = 0;
  while( true ) {
    sVar1 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::size(matrix);
    if (sVar1 <= (ulong)(long)local_20) break;
    this = std::
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ::operator[](matrix,(long)local_20);
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](this,(long)j);
    if (*pvVar2 == n) {
      local_1c = local_1c + 1;
    }
    local_20 = local_20 + 1;
  }
  return local_1c;
}

Assistant:

int count_cols(MATRIX &matrix, int n, int j){
    int n_columns=0;
    for(int i=0; i<matrix.size(); i++){
        if (matrix[i][j]==n){
            n_columns++;
        }
    }
    return n_columns;
}